

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSO.h
# Opt level: O2

pair<std::vector<double,_std::allocator<double>_>,_double> * __thiscall
PSO::optimize(pair<std::vector<double,_std::allocator<double>_>,_double> *__return_storage_ptr__,
             PSO *this,
             function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
             *fitFunc)

{
  int iVar1;
  value_type_conflict *pvVar2;
  pointer pdVar3;
  pair<std::vector<double,_std::allocator<double>_>,_double> *this_00;
  ulong uVar4;
  ostream *poVar5;
  double *col;
  value_type_conflict *__x;
  long lVar6;
  int j;
  long lVar7;
  result_type_conflict rVar8;
  double dVar9;
  anon_class_16_2_158dac29 __gen;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> globalBest;
  vector<double,_std::allocator<double>_> localBest;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  particles;
  vector<double,_std::allocator<double>_> temp;
  Environment ENV;
  vector<double,_std::allocator<double>_> velocity;
  mt19937 mersenne;
  allocator_type local_15d9;
  pointer local_15d8;
  function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)> *local_15d0;
  _Vector_base<double,_std::allocator<double>_> local_15c8;
  double local_15b0;
  _Vector_base<double,_std::allocator<double>_> local_15a8;
  double local_1590;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1588;
  pair<std::vector<double,_std::allocator<double>_>,_double> local_1568;
  Point_<int> local_1548;
  Point_<int> local_1540;
  Point_<int> local_1538;
  Point_<int> local_1530;
  Point_<int> local_1528;
  Point_<int> local_1520;
  Point_<int> local_1518;
  pair<std::vector<double,_std::allocator<double>_>,_double> *local_1510;
  pointer local_1508;
  Environment local_1500;
  _Vector_base<double,_std::allocator<double>_> local_14f8;
  _Vector_base<double,_std::allocator<double>_> local_14e0;
  _Vector_base<double,_std::allocator<double>_> local_14c8;
  _Vector_base<double,_std::allocator<double>_> local_14b0;
  _Vector_base<double,_std::allocator<double>_> local_1498;
  _Vector_base<double,_std::allocator<double>_> local_1480;
  uniform_real_distribution<double> local_1468;
  uniform_real_distribution<double> local_1458;
  Point_<int> local_1440;
  Point_<int> local_1438;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1430;
  _Vector_base<double,_std::allocator<double>_> local_1418;
  _Vector_base<double,_std::allocator<double>_> local_1400;
  _Vector_base<double,_std::allocator<double>_> local_13e8;
  _Vector_base<double,_std::allocator<double>_> local_13d0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_15d0 = fitFunc;
  Environment::Environment(&local_1500);
  uVar4 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,uVar4 & 0xffffffff);
  local_1458._M_param._M_a = this->minRand;
  local_1458._M_param._M_b = this->maxRand;
  local_1468._M_param._M_a = 0.0;
  local_1468._M_param._M_b = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_15a8,(long)this->numberOfDimensions,
             (allocator_type *)&local_1568);
  __gen.mersenne = &local_13b8;
  __gen.rnd1 = &local_1458;
  std::
  generate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,PSO::optimize(std::function<double(std::vector<double,std::allocator<double>>,cv::Point_<int>)>)::_lambda()_1_>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_15a8._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_15a8._M_impl.super__Vector_impl_data._M_finish,__gen);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_15c8,(long)this->numberOfDimensions,
             (allocator_type *)&local_1568);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_15c8,
             (vector<double,_std::allocator<double>_> *)&local_15a8);
  local_1588.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1588.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1588.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = this->numberOfParticles;
  local_14f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1568.first,(long)this->numberOfDimensions,(value_type_conflict *)&local_14f8,
             &local_15d9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&local_1588,(long)iVar1,&local_1568.first);
  local_1510 = __return_storage_ptr__;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_1568);
  local_14f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_14f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1568.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&local_14f8,(long)this->numberOfDimensions,
             (value_type_conflict *)&local_1568);
  local_1508 = local_1588.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  for (local_15d8 = local_1588.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; local_15d8 != local_1508;
      local_15d8 = local_15d8 + 1) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1568.first,(long)this->numberOfDimensions,&local_15d9);
    if (local_1568.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1568.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1568.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1568.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    pvVar2 = (local_15d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (local_15d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
      rVar8 = std::uniform_real_distribution<double>::operator()(&local_1458,&local_13b8);
      *__x = rVar8;
      std::vector<double,_std::allocator<double>_>::push_back(&local_1568.first,__x);
    }
    if (local_15a8._M_impl.super__Vector_impl_data._M_finish !=
        local_15a8._M_impl.super__Vector_impl_data._M_start) {
      local_15a8._M_impl.super__Vector_impl_data._M_finish =
           local_15a8._M_impl.super__Vector_impl_data._M_start;
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_15a8,&local_1568.first);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_1480,
               (vector<double,_std::allocator<double>_> *)&local_15a8);
    local_1518.x = local_1500.goal.x;
    local_1518.y = local_1500.goal.y;
    local_15b0 = std::
                 function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
                 operator()(local_15d0,(vector<double,_std::allocator<double>_> *)&local_1480,
                            &local_1518);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_13d0,
               (vector<double,_std::allocator<double>_> *)&local_15c8);
    local_1520.x = local_1500.goal.x;
    local_1520.y = local_1500.goal.y;
    local_1590 = std::
                 function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
                 operator()(local_15d0,(vector<double,_std::allocator<double>_> *)&local_13d0,
                            &local_1520);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_13d0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1480);
    if (local_15b0 < local_1590) {
      if (local_15c8._M_impl.super__Vector_impl_data._M_finish !=
          local_15c8._M_impl.super__Vector_impl_data._M_start) {
        local_15c8._M_impl.super__Vector_impl_data._M_finish =
             local_15c8._M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)&local_15c8,
                 (vector<double,_std::allocator<double>_> *)&local_15a8);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_1568);
  }
  local_1590 = 0.0;
  while( true ) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_14e0,
               (vector<double,_std::allocator<double>_> *)&local_15c8);
    local_1528.x = local_1500.goal.x;
    local_1528.y = local_1500.goal.y;
    dVar9 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
            operator()(local_15d0,(vector<double,_std::allocator<double>_> *)&local_14e0,&local_1528
                      );
    if (dVar9 < this->errorCon || dVar9 == this->errorCon) break;
    iVar1 = this->maximumOfIteration;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_14e0);
    if (iVar1 <= SUB84(local_1590,0)) goto LAB_00102cc1;
    local_1590 = (double)(ulong)(SUB84(local_1590,0) + 1);
    for (lVar6 = 0; lVar6 < this->numberOfParticles; lVar6 = lVar6 + 1) {
      for (lVar7 = 0; lVar7 < this->numberOfDimensions; lVar7 = lVar7 + 1) {
        local_15d8 = (pointer)std::uniform_real_distribution<double>::operator()
                                        (&local_1468,&local_13b8);
        rVar8 = std::uniform_real_distribution<double>::operator()(&local_1468,&local_13b8);
        pdVar3 = local_1588.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar6].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar9 = (local_15c8._M_impl.super__Vector_impl_data._M_start[lVar7] - pdVar3[lVar7]) *
                rVar8 * this->C2 +
                this->W * local_14f8._M_impl.super__Vector_impl_data._M_start[lVar7] +
                (local_15a8._M_impl.super__Vector_impl_data._M_start[lVar7] - pdVar3[lVar7]) *
                (double)local_15d8 * this->C1;
        local_14f8._M_impl.super__Vector_impl_data._M_start[lVar7] = dVar9;
        pdVar3[lVar7] = dVar9 + pdVar3[lVar7];
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1498,
                 local_1588.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      local_1530.x = local_1500.goal.x;
      local_1530.y = local_1500.goal.y;
      local_15d8 = (pointer)std::
                            function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
                            ::operator()(local_15d0,
                                         (vector<double,_std::allocator<double>_> *)&local_1498,
                                         &local_1530);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_13e8,
                 (vector<double,_std::allocator<double>_> *)&local_15a8);
      local_1538.x = local_1500.goal.x;
      local_1538.y = local_1500.goal.y;
      local_15b0 = std::
                   function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
                   ::operator()(local_15d0,(vector<double,_std::allocator<double>_> *)&local_13e8,
                                &local_1538);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_13e8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1498);
      if ((double)local_15d8 < local_15b0) {
        if (local_15a8._M_impl.super__Vector_impl_data._M_finish !=
            local_15a8._M_impl.super__Vector_impl_data._M_start) {
          local_15a8._M_impl.super__Vector_impl_data._M_finish =
               local_15a8._M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)&local_15a8,
                   local_1588.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar6);
      }
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_1400,
               (vector<double,_std::allocator<double>_> *)&local_15a8);
    local_1540.x = local_1500.goal.x;
    local_1540.y = local_1500.goal.y;
    local_15d8 = (pointer)std::
                          function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
                          ::operator()(local_15d0,
                                       (vector<double,_std::allocator<double>_> *)&local_1400,
                                       &local_1540);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_1418,
               (vector<double,_std::allocator<double>_> *)&local_15c8);
    local_1548.x = local_1500.goal.x;
    local_1548.y = local_1500.goal.y;
    local_15b0 = std::
                 function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
                 operator()(local_15d0,(vector<double,_std::allocator<double>_> *)&local_1418,
                            &local_1548);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1418);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1400);
    if ((double)local_15d8 < local_15b0) {
      if (local_15c8._M_impl.super__Vector_impl_data._M_finish !=
          local_15c8._M_impl.super__Vector_impl_data._M_start) {
        local_15c8._M_impl.super__Vector_impl_data._M_finish =
             local_15c8._M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)&local_15c8,
                 (vector<double,_std::allocator<double>_> *)&local_15a8);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_1430,&local_1588);
    Environment::Update(&local_1500,&local_1430);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_1430);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_14e0);
LAB_00102cc1:
  poVar5 = std::operator<<((ostream *)&std::cout,"Goal Point Is : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1500.goal.x);
  poVar5 = std::operator<<(poVar5," , ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1500.goal.y);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_14b0,
             (vector<double,_std::allocator<double>_> *)&local_15c8);
  this_00 = local_1510;
  local_1438.x = local_1500.goal.x;
  local_1438.y = local_1500.goal.y;
  local_15d8 = (pointer)std::
                        function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
                        ::operator()(local_15d0,
                                     (vector<double,_std::allocator<double>_> *)&local_14b0,
                                     &local_1438);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1568.first,(vector<double,_std::allocator<double>_> *)&local_15c8);
  local_1568.second = (double)local_15d8;
  std::pair<std::vector<double,_std::allocator<double>_>,_double>::operator=
            (&this->result,&local_1568);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_1568);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_14b0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_14c8,
             (vector<double,_std::allocator<double>_> *)&local_15c8);
  local_1440.x = local_1500.goal.x;
  local_1440.y = local_1500.goal.y;
  local_15d8 = (pointer)std::
                        function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
                        ::operator()(local_15d0,
                                     (vector<double,_std::allocator<double>_> *)&local_14c8,
                                     &local_1440);
  std::vector<double,_std::allocator<double>_>::vector
            (&this_00->first,(vector<double,_std::allocator<double>_> *)&local_15c8);
  this_00->second = (double)local_15d8;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_14c8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_14f8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1588);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_15c8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_15a8);
  return this_00;
}

Assistant:

auto optimize( function<double (vector<double>, Point )> fitFunc )
    {
        // Set A Instance From Environment And Get Goal Position
        Environment ENV;
        auto goal = ENV.getGoal();

        mt19937 mersenne( static_cast<unsigned int>( time( nullptr ) ) );
        uniform_real_distribution<> rnd1( minRand, maxRand );
        uniform_real_distribution<> rnd2( 0, 1 );

        vector<double> localBest( numberOfDimensions );
        generate( localBest.begin(), localBest.end(), [&]{ return rnd1( mersenne );} );

        vector<double> globalBest( numberOfDimensions );
        globalBest = localBest;

        vector <vector<double> > particles;
        particles.resize( numberOfParticles, vector<double>( numberOfDimensions, 0 ) );

        vector<double> velocity;
        velocity.resize( numberOfDimensions, 0 );

        for ( auto &row : particles )
        {
            vector<double> temp( numberOfDimensions );
            temp.clear();

            for ( auto &col : row )
            {
                col = rnd1( mersenne );
                temp.push_back( col );
            }

            localBest.clear();
            localBest = temp;

            if ( fitFunc( localBest, goal ) < fitFunc( globalBest, goal ) )
            {
                globalBest.clear();
                globalBest = localBest;
            }
        }

        int iterator = 0;
        while ( fitFunc( globalBest, goal ) > errorCon and iterator < maximumOfIteration )
        {
            ++iterator;
            for ( int i = 0; i < numberOfParticles; ++i )
            {
                for ( int j = 0; j < numberOfDimensions; ++j )
                {
                    double r1 = rnd2( mersenne );
                    double r2 = rnd2( mersenne );

                    velocity[j] = W * velocity[j] 
                                    + ( C1 * r1 * ( localBest[j]  - particles[i][j] ) )
                                    + ( C2 * r2 * ( globalBest[j] - particles[i][j] ) );

                    particles[i][j] = particles[i][j] + velocity[j];
                }

                if ( fitFunc( particles[i], goal ) < fitFunc( localBest, goal ) )
                {
                    localBest.clear();
                    localBest = particles[i];
                }
            }

            if ( fitFunc( localBest, goal ) < fitFunc( globalBest, goal ) )
            {
                globalBest.clear();
                globalBest = localBest;
            }
            
            // Update Monitor
            ENV.Update( particles );
        }

        // Print Goal Position
        cout<<"Goal Point Is : "<<goal.x<<" , "<<goal.y<<endl;

        this->result = make_pair( globalBest, fitFunc(globalBest, goal) );
        return make_pair( globalBest, fitFunc(globalBest, goal) );

    }